

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

int __thiscall QIODevice::close(QIODevice *this,int __fd)

{
  bool bVar1;
  QIODevicePrivate *this_00;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> lhs;
  long in_FS_OFFSET;
  QIODevicePrivate *unaff_retaddr;
  QIODevicePrivate *d;
  OpenModeFlag in_stack_ffffffffffffffdc;
  Int local_10;
  long lVar2;
  
  lhs.i = (Int)((ulong)this >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QIODevice *)0x130255);
  bVar1 = ::operator==((QFlags<QIODeviceBase::OpenModeFlag>)lhs.i,(OpenModeFlag)this_00);
  if (!bVar1) {
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,in_stack_ffffffffffffffdc);
    (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_10;
    this_00->pos = 0;
    this_00->transactionStarted = false;
    this_00->transactionPos = 0;
    QIODevicePrivate::setReadChannelCount(unaff_retaddr,(int)((ulong)lVar2 >> 0x20));
    this_00->writeChannelCount = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QIODevice::close()
{
    Q_D(QIODevice);
    if (d->openMode == NotOpen)
        return;

#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::close()\n", this);
#endif

#ifndef QT_NO_QOBJECT
    emit aboutToClose();
#endif
    d->openMode = NotOpen;
    d->pos = 0;
    d->transactionStarted = false;
    d->transactionPos = 0;
    d->setReadChannelCount(0);
    // Do not clear write buffers to allow delayed close in sockets
    d->writeChannelCount = 0;
}